

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_minnow_byt_compatible.c
# Opt level: O3

mraa_result_t mraa_intel_minnowboard_get_pin_index(mraa_board_t *board,char *name,int *pin_index)

{
  int iVar1;
  int iVar2;
  long lVar3;
  mraa_pininfo_t *__s2;
  
  iVar1 = board->phy_pin_count;
  if (0 < (long)iVar1) {
    __s2 = board->pins;
    lVar3 = 0;
    do {
      iVar2 = strncmp(name,__s2->name,8);
      if (iVar2 == 0) {
        *pin_index = (int)lVar3;
        return MRAA_SUCCESS;
      }
      lVar3 = lVar3 + 1;
      __s2 = __s2 + 1;
    } while (iVar1 != lVar3);
  }
  return MRAA_ERROR_INVALID_RESOURCE;
}

Assistant:

mraa_result_t
mraa_intel_minnowboard_get_pin_index(mraa_board_t* board, char* name, int* pin_index)
{
    int i;
    for (i = 0; i < board->phy_pin_count; ++i) {
        if (strncmp(name, board->pins[i].name, MAX_LENGTH) == 0) {
            *pin_index = i;
            return MRAA_SUCCESS;
        }
    }
    return MRAA_ERROR_INVALID_RESOURCE;
}